

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caption.c
# Opt level: O3

libcaption_stauts_t caption_frame_decode_preamble(caption_frame_t *frame,uint16_t cc_data)

{
  int iVar1;
  int uln;
  int col;
  int row;
  eia608_style_t sty;
  int chn;
  byte local_1c [4];
  int8_t local_18 [4];
  int8_t local_14 [4];
  undefined1 local_10 [4];
  int local_c;
  
  iVar1 = eia608_parse_preamble
                    (cc_data,(int *)local_14,(int *)local_18,(eia608_style_t *)local_10,&local_c,
                     (int *)local_1c);
  if (iVar1 != 0) {
    (frame->state).row = local_14[0];
    (frame->state).col = local_18[0];
    *(byte *)&frame->state =
         local_1c[0] & 1 | *(byte *)&frame->state & 0xf0 | local_10[0] * '\x02' & 0xeU;
  }
  return LIBCAPTION_OK;
}

Assistant:

libcaption_stauts_t caption_frame_decode_preamble(caption_frame_t* frame, uint16_t cc_data)
{
    eia608_style_t sty;
    int row, col, chn, uln;

    if (eia608_parse_preamble(cc_data, &row, &col, &sty, &chn, &uln)) {
        frame->state.row = row;
        frame->state.col = col;
        frame->state.sty = sty;
        frame->state.uln = uln;
    }

    return LIBCAPTION_OK;
}